

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O1

MPP_RET update_reference_list(Av1CodecContext *ctx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  void *pvVar12;
  char *pcVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  RK_S32 RVar21;
  undefined4 *puVar22;
  long *plVar23;
  long lVar24;
  ulong uVar25;
  
  pvVar12 = ctx->priv_data;
  pcVar13 = *(char **)((long)pvVar12 + 0x68);
  puVar22 = (undefined4 *)((long)pvVar12 + 0x1d3c4);
  lVar24 = 0;
  do {
    if (((byte)pcVar13[0xb1] >> ((uint)lVar24 & 0x1f) & 1) != 0) {
      uVar10 = *(undefined4 *)(pcVar13 + 0x14);
      uVar11 = *(undefined4 *)((long)pvVar12 + 0x1bac);
      uVar14 = *(undefined8 *)((long)pvVar12 + 0x1ba4);
      uVar15 = *(undefined8 *)((long)pvVar12 + 0x1bb0);
      bVar1 = pcVar13[0xc];
      bVar2 = *(byte *)(*(long *)((long)pvVar12 + 0x58) + 0x247);
      bVar3 = *(byte *)(*(long *)((long)pvVar12 + 0x58) + 0x248);
      uVar16 = *(undefined8 *)((long)pvVar12 + 0x1b9c);
      *puVar22 = 1;
      puVar22[1] = uVar10;
      puVar22[2] = uVar11;
      *(undefined8 *)(puVar22 + 3) = uVar14;
      *(undefined8 *)(puVar22 + 5) = uVar15;
      puVar22[7] = (uint)bVar1;
      puVar22[8] = (uint)bVar2;
      puVar22[9] = (uint)bVar3;
      *(undefined8 *)(puVar22 + 10) = uVar16;
      memset(puVar22 + 0xc,0,0xcc);
      *(undefined8 *)(puVar22 + 0xc) = *(undefined8 *)(pcVar13 + 0x25c);
      *(undefined2 *)(puVar22 + 0xe) = *(undefined2 *)(pcVar13 + 0x266);
      uVar14 = *(undefined8 *)(pcVar13 + 0x185);
      uVar15 = *(undefined8 *)(pcVar13 + 0x18d);
      uVar16 = *(undefined8 *)(pcVar13 + 0x195);
      uVar17 = *(undefined8 *)(pcVar13 + 0x19d);
      uVar18 = *(undefined8 *)(pcVar13 + 0x1a5);
      uVar19 = *(undefined8 *)(pcVar13 + 0x1ad);
      uVar20 = *(undefined8 *)(pcVar13 + 0x1bd);
      *(undefined8 *)((long)puVar22 + 0x6a) = *(undefined8 *)(pcVar13 + 0x1b5);
      *(undefined8 *)((long)puVar22 + 0x72) = uVar20;
      *(undefined8 *)((long)puVar22 + 0x5a) = uVar18;
      *(undefined8 *)((long)puVar22 + 0x62) = uVar19;
      *(undefined8 *)((long)puVar22 + 0x4a) = uVar16;
      *(undefined8 *)((long)puVar22 + 0x52) = uVar17;
      *(undefined8 *)((long)puVar22 + 0x3a) = uVar14;
      *(undefined8 *)((long)puVar22 + 0x42) = uVar15;
      memcpy((void *)((long)puVar22 + 0x7a),pcVar13 + 0x1c6,0x80);
    }
    lVar24 = lVar24 + 1;
    puVar22 = puVar22 + 0x3f;
  } while (lVar24 != 8);
  if (*pcVar13 == '\0') {
    cVar4 = pcVar13[0xc1];
    cVar5 = pcVar13[0xc2];
    cVar6 = pcVar13[0xc5];
    cVar7 = pcVar13[0xbf];
    cVar8 = pcVar13[0xc3];
    cVar9 = pcVar13[0xc4];
    lVar24 = *(long *)((long)pvVar12 + 7000);
    *(uint *)(lVar24 + 0x10) = (uint)*(byte *)((long)pvVar12 + (long)pcVar13[0xc0] * 0x2f8 + 200);
    *(uint *)(lVar24 + 0x14) = (uint)*(byte *)((long)pvVar12 + (long)cVar4 * 0x2f8 + 200);
    *(uint *)(lVar24 + 0x18) = (uint)*(byte *)((long)pvVar12 + (long)cVar5 * 0x2f8 + 200);
    *(uint *)(lVar24 + 0x24) = (uint)*(byte *)((long)pvVar12 + (long)cVar6 * 0x2f8 + 200);
    *(uint *)(lVar24 + 0xc) = (uint)*(byte *)((long)pvVar12 + (long)cVar7 * 0x2f8 + 200);
    *(uint *)(lVar24 + 0x1c) = (uint)*(byte *)((long)pvVar12 + (long)cVar8 * 0x2f8 + 200);
    *(uint *)(lVar24 + 0x20) = (uint)*(byte *)((long)pvVar12 + (long)cVar9 * 0x2f8 + 200);
  }
  plVar23 = (long *)((long)pvVar12 + 0x398);
  uVar25 = 0;
  do {
    if (((byte)av1d_debug & 4) != 0) {
      _mpp_log_l(4,"av1d_parser","header->refresh_frame_flags = %d","update_reference_list",
                 (ulong)(byte)pcVar13[0xb1]);
    }
    if (((byte)pcVar13[0xb1] >> ((uint)uVar25 & 0x1f) & 1) != 0) {
      if (((byte)av1d_debug & 4) != 0) {
        _mpp_log_l(4,"av1d_parser","av1 ref idx %d s->ref[%d].slot_index %d","update_reference_list"
                   ,uVar25 & 0xffffffff,uVar25 & 0xffffffff,(int)plVar23[-0x5d]);
      }
      if (*plVar23 != 0) {
        av1d_frame_unref(ctx,(AV1Frame *)(plVar23 + -0x5e));
      }
      RVar21 = av1d_frame_ref(ctx,(AV1Frame *)(plVar23 + -0x5e),(AV1Frame *)((long)pvVar12 + 0x1868)
                             );
      if (RVar21 < 0) {
        _mpp_log_l(2,"av1d_parser","Failed to update frame %d in reference list\n",
                   "update_reference_list",uVar25 & 0xffffffff);
        return MPP_NOK;
      }
    }
    uVar25 = uVar25 + 1;
    plVar23 = plVar23 + 0x5f;
    if (uVar25 == 8) {
      return MPP_OK;
    }
  } while( true );
}

Assistant:

static MPP_RET update_reference_list(Av1CodecContext *ctx)
{
    AV1Context *s = ctx->priv_data;
    const AV1RawFrameHeader *header = s->raw_frame_header;
    MPP_RET ret = MPP_OK;
    RK_S32 i = 0;
    RK_S32 lst2_buf_idx;
    RK_S32 lst3_buf_idx;
    RK_S32 gld_buf_idx;
    RK_S32 alt_buf_idx;
    RK_S32 lst_buf_idx;
    RK_S32 bwd_buf_idx;
    RK_S32 alt2_buf_idx;

    for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
        if (header->refresh_frame_flags & (1 << i)) {
            s->ref_s[i] = (AV1ReferenceFrameState) {
                .valid = 1,
                 .frame_id = header->current_frame_id,
                  .upscaled_width = s->upscaled_width,
                   .frame_width = s->frame_width,
                    .frame_height = s->frame_height,
                     .render_width = s->render_width,
                      .render_height = s->render_height,
                       .frame_type = header->frame_type,
                        .subsampling_x = s->sequence_header->color_config.subsampling_x,
                         .subsampling_y = s->sequence_header->color_config.subsampling_y,
                          .bit_depth = s->bit_depth,
                           .order_hint = s->order_hint,
            };
            memcpy(s->ref_s[i].loop_filter_ref_deltas, header->loop_filter_ref_deltas,
                   sizeof(header->loop_filter_ref_deltas));
            memcpy(s->ref_s[i].loop_filter_mode_deltas, header->loop_filter_mode_deltas,
                   sizeof(header->loop_filter_mode_deltas));
            memcpy(s->ref_s[i].feature_enabled, header->feature_enabled,
                   sizeof(header->feature_enabled));
            memcpy(s->ref_s[i].feature_value, header->feature_value,
                   sizeof(header->feature_value));
        }
    }

    if (!header->show_existing_frame) {
        lst2_buf_idx = s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_LAST2 - AV1_REF_FRAME_LAST];
        lst3_buf_idx = s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_LAST3 - AV1_REF_FRAME_LAST];
        gld_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_GOLDEN - AV1_REF_FRAME_LAST];
        alt_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_ALTREF - AV1_REF_FRAME_LAST];
        lst_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_LAST - AV1_REF_FRAME_LAST];
        bwd_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_BWDREF - AV1_REF_FRAME_LAST];
        alt2_buf_idx = s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_ALTREF2 - AV1_REF_FRAME_LAST];

        s->cur_frame.ref->lst2_frame_offset = s->ref[lst2_buf_idx].order_hint;
        s->cur_frame.ref->lst3_frame_offset = s->ref[lst3_buf_idx].order_hint;
        s->cur_frame.ref->gld_frame_offset  = s->ref[gld_buf_idx].order_hint;
        s->cur_frame.ref->alt_frame_offset  = s->ref[alt_buf_idx].order_hint;
        s->cur_frame.ref->lst_frame_offset  = s->ref[lst_buf_idx].order_hint;
        s->cur_frame.ref->bwd_frame_offset  = s->ref[bwd_buf_idx].order_hint;
        s->cur_frame.ref->alt2_frame_offset = s->ref[alt2_buf_idx].order_hint;
    }

    for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
        av1d_dbg(AV1D_DBG_REF, "header->refresh_frame_flags = %d",
                 header->refresh_frame_flags);
        if (header->refresh_frame_flags & (1 << i)) {
            av1d_dbg(AV1D_DBG_REF, "av1 ref idx %d s->ref[%d].slot_index %d",
                     i, i, s->ref[i].slot_index);
            if (s->ref[i].ref)
                av1d_frame_unref(ctx, &s->ref[i]);

            if ((ret = av1d_frame_ref(ctx, &s->ref[i], &s->cur_frame)) < 0) {
                mpp_err_f("Failed to update frame %d in reference list\n", i);
                return ret;
            }
        }
    }
    return ret;
}